

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_printer.cc
# Opt level: O2

void __thiscall LinePrinter::SetConsoleLocked(LinePrinter *this,bool locked)

{
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if (this->console_locked_ != locked) {
    if (locked) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_59);
      PrintOnNewLine(this,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      this->console_locked_ = locked;
    }
    else {
      this->console_locked_ = locked;
      PrintOnNewLine(this,&this->output_buffer_);
      if ((this->line_buffer_)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&local_38,(string *)&this->line_buffer_);
        Print(this,&local_38,this->line_type_);
        std::__cxx11::string::~string((string *)&local_38);
      }
      (this->output_buffer_)._M_string_length = 0;
      *(this->output_buffer_)._M_dataplus._M_p = '\0';
      (this->line_buffer_)._M_string_length = 0;
      *(this->line_buffer_)._M_dataplus._M_p = '\0';
    }
  }
  return;
}

Assistant:

void LinePrinter::SetConsoleLocked(bool locked) {
  if (locked == console_locked_)
    return;

  if (locked)
    PrintOnNewLine("");

  console_locked_ = locked;

  if (!locked) {
    PrintOnNewLine(output_buffer_);
    if (!line_buffer_.empty()) {
      Print(line_buffer_, line_type_);
    }
    output_buffer_.clear();
    line_buffer_.clear();
  }
}